

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O2

void destroy_curious_dynamic_array(curious_dynamic_array_t *self,free_f destroy_el)

{
  int i;
  long lVar1;
  
  if (destroy_el != (free_f)0x0) {
    for (lVar1 = 0; lVar1 <= self->last_el; lVar1 = lVar1 + 1) {
      (*destroy_el)((void *)(self->el_size * lVar1 + (long)self->array));
    }
  }
  free(self->array);
  return;
}

Assistant:

void destroy_curious_dynamic_array(curious_dynamic_array_t* self, free_f destroy_el)
{
    if (NULL != destroy_el) {
        //destroy each element in the array...
        for (int i = 0; i <= self->last_el; ++i) {
            destroy_el(get_from_curious_dynamic_array(self, i));
        }
    }

    //...and only afterwards free the array itself
    free(self->array);
}